

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_serializer.cpp
# Opt level: O0

Table * getFromCsv(Table *__return_storage_ptr__,string *fileName)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  reference pcVar6;
  char *pcVar7;
  string local_3b8;
  string local_398;
  char local_371;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_370;
  char ch_2;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined1 local_350 [4];
  int cnt;
  string local_330;
  char local_309;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_308;
  char ch_1;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  int cnt_1;
  bool is_defined;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columns;
  string cur;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_228 [8];
  fstream in;
  string *fileName_local;
  Table *t;
  
  std::fstream::fstream(local_228,(string *)fileName,_S_in);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&str.field_2 + 8),"File ",fileName);
    std::operator+(&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&str.field_2 + 8)," can\'t be opened\n");
    std::operator<<((ostream *)&std::cerr,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
    exit(1);
  }
  std::__cxx11::string::string((string *)(cur.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &columns.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (local_228,(string *)(cur.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)(cur.field_2._M_local_buf + 8),',');
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _cnt_1 = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&cnt_1), bVar2) {
    pcVar6 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if (*pcVar6 == ',') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,
                  (value_type *)
                  &columns.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)
                 &columns.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    }
    else {
      std::__cxx11::string::operator+=
                ((string *)
                 &columns.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,*pcVar6);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  Table::Table(__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
  bVar2 = false;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_228,(string *)(cur.field_2._M_local_buf + 8));
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar3) break;
    std::__cxx11::string::operator+=((string *)(cur.field_2._M_local_buf + 8),',');
    if (bVar2) {
      __range2._4_4_ = 0;
      __end2._M_current = (char *)std::__cxx11::string::begin();
      _Stack_370._M_current = (char *)std::__cxx11::string::end();
      while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffc90), bVar3) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
        local_371 = *pcVar6;
        if (local_371 != ' ') {
          if (local_371 == ',') {
            pcVar7 = (char *)std::__cxx11::string::operator[]
                                       ((ulong)&columns.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iVar4 = isdigit((int)*pcVar7);
            if (iVar4 == 0) {
              std::__cxx11::string::string
                        ((string *)&local_3b8,
                         (string *)
                         &columns.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Table::push_new_value_in_column(__return_storage_ptr__,__range2._4_4_,&local_3b8);
              std::__cxx11::string::~string((string *)&local_3b8);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&local_398,
                         (string *)
                         &columns.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Table::push_new_value_in_column(__return_storage_ptr__,__range2._4_4_,&local_398);
              std::__cxx11::string::~string((string *)&local_398);
            }
            std::__cxx11::string::operator=
                      ((string *)
                       &columns.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
            __range2._4_4_ = __range2._4_4_ + 1;
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)
                       &columns.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_371);
          }
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
    }
    else {
      __range3._0_4_ = 0;
      __end3._M_current = (char *)std::__cxx11::string::begin();
      _Stack_308._M_current = (char *)std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffcf8), bVar2) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
        local_309 = *pcVar6;
        if (local_309 != ' ') {
          if (local_309 == ',') {
            pcVar7 = (char *)std::__cxx11::string::operator[]
                                       ((ulong)&columns.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iVar4 = isdigit((int)*pcVar7);
            if (iVar4 == 0) {
              Table::define_column_type(__return_storage_ptr__,(int)__range3,STRING);
              std::__cxx11::string::string
                        ((string *)local_350,
                         (string *)
                         &columns.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Table::push_new_value_in_column
                        (__return_storage_ptr__,(int)__range3,(string *)local_350);
              std::__cxx11::string::~string((string *)local_350);
            }
            else {
              Table::define_column_type(__return_storage_ptr__,(int)__range3,FLOAT);
              std::__cxx11::string::string
                        ((string *)&local_330,
                         (string *)
                         &columns.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Table::push_new_value_in_column(__return_storage_ptr__,(int)__range3,&local_330);
              std::__cxx11::string::~string((string *)&local_330);
            }
            std::__cxx11::string::operator=
                      ((string *)
                       &columns.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
            __range3._0_4_ = (int)__range3 + 1;
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)
                       &columns.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_309);
          }
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      bVar2 = true;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string
            ((string *)
             &columns.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(cur.field_2._M_local_buf + 8));
  std::fstream::~fstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

Table getFromCsv(const std::string &fileName) {
    std::fstream in(fileName, std::ios::in);
    if (!in.is_open()){
        std::cerr << "File "+fileName+" can't be opened\n";
        exit(EXIT_FAILURE);
    }
    std::string str, cur;
    std::vector<std::string> columns;
    std::getline(in, str);
    str += ',';
    for (char ch:str){
        if (ch == ','){
            columns.push_back(cur);
            cur = "";
        }else
            cur += ch;
    }
    Table t(columns);
    bool is_defined = false;
    while (std::getline(in, str)){
        str += ',';
        if (!is_defined){
            int cnt = 0;
            for (char ch:str){
                if (ch == ' ') continue;
                if (ch == ','){
                    if (isdigit(cur[0])){
                        t.define_column_type(cnt, t.FLOAT);
                        t.push_new_value_in_column(cnt, cur);
                    }else{
                        t.define_column_type(cnt, t.STRING);
                        t.push_new_value_in_column(cnt, cur);
                    }
                    cur = "";
                    cnt++;
                }else
                    cur += ch;
            }
            is_defined = true;
            continue;
        }
        int cnt = 0;
        for (char ch:str){
            if (ch == ' ') continue;
            if (ch == ','){
                if (isdigit(cur[0])){
                    t.push_new_value_in_column(cnt, cur);
                }else{
                    t.push_new_value_in_column(cnt, cur);
                }
                cur = "";
                cnt++;
            }else
                cur += ch;
        }
    }
    return t;
}